

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_ERROR sinc_mono_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  int iVar2;
  int iVar3;
  SINC_FILTER *filter;
  undefined1 auVar4 [16];
  SRC_ERROR SVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar5 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar9 = state->channels;
    filter->in_count = data->input_frames * (long)iVar9;
    filter->out_count = data->output_frames * (long)iVar9;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar18 = state->last_ratio;
    SVar5 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar18) && (dVar18 <= 256.0)) {
      dVar15 = dVar18;
      if (data->src_ratio <= dVar18) {
        dVar15 = data->src_ratio;
      }
      dVar17 = state->last_position;
      dVar20 = dVar17 - (double)(int)ROUND(dVar17);
      dVar20 = (double)(~-(ulong)(dVar20 < 0.0) & (ulong)dVar20 |
                       (ulong)(dVar20 + 1.0) & -(ulong)(dVar20 < 0.0));
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar20;
      filter->b_current = ((int)ROUND(dVar17 - dVar20) * iVar9 + filter->b_current) % filter->b_len;
      if (filter->out_gen < filter->out_count) {
        dVar17 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        iVar9 = ((int)ROUND((double)(-(ulong)(dVar15 < 1.0) & (ulong)(dVar17 / dVar15) |
                                    ~-(ulong)(dVar15 < 1.0) & (ulong)dVar17)) + 1) * iVar9;
        dVar15 = 1.0 / dVar18;
        do {
          dVar20 = auVar22._0_8_;
          if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar9) {
            SVar5 = prepare_data(filter,state->channels,data,iVar9);
            state->error = SVar5;
            if (SVar5 != SRC_ERR_NO_ERROR) {
              return SVar5;
            }
            if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar9)
            break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end < (double)filter->b_current + dVar20 + dVar15 + 1e-20))
          break;
          if (0 < filter->out_count) {
            dVar17 = state->last_ratio;
            if (1e-10 < ABS(dVar17 - data->src_ratio)) {
              dVar18 = ((data->src_ratio - dVar17) * (double)filter->out_gen) /
                       (double)filter->out_count + dVar17;
            }
          }
          dVar17 = dVar18;
          if (1.0 <= dVar18) {
            dVar17 = 1.0;
          }
          dVar17 = dVar17 * (double)filter->index_inc;
          uVar10 = (uint)ROUND(dVar17 * 4096.0);
          iVar12 = (int)ROUND(dVar20 * dVar17 * 4096.0);
          iVar2 = filter->coeff_half_len;
          iVar3 = filter->b_current;
          iVar6 = (iVar2 * 0x1000 - iVar12) / (int)uVar10;
          uVar13 = iVar6 * uVar10 + iVar12;
          uVar14 = iVar3 - iVar6;
          if ((int)uVar14 < 0) {
            if (((int)uVar10 < 1) || ((int)uVar13 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar7 = ((uVar10 + uVar13) - 1) / uVar10;
            if (SBORROW4(uVar7,-uVar14) != (int)(uVar7 + uVar14) < 0) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x184,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            uVar13 = uVar14 * uVar10 + uVar13;
            uVar14 = 0;
          }
          dVar19 = 0.0;
          dVar21 = 0.0;
          if (-1 < (int)uVar13) {
            uVar8 = (ulong)uVar14;
            dVar21 = 0.0;
            do {
              uVar14 = uVar13 >> 0xc;
              if (iVar2 < (int)uVar14) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x18c,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              if ((long)filter->b_len <= (long)uVar8) {
                __assert_fail("data_index >= 0 && data_index < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x18e,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              if ((long)filter->b_end <= (long)uVar8) {
                __assert_fail("data_index < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,399,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              fVar1 = filter->coeffs[uVar14];
              dVar21 = dVar21 + (double)filter->buffer[uVar8] *
                                ((double)(uVar13 & 0xfff) * 0.000244140625 *
                                 (double)(filter->coeffs[(ulong)uVar14 + 1] - fVar1) + (double)fVar1
                                );
              uVar8 = uVar8 + 1;
              uVar13 = uVar13 - uVar10;
            } while (-1 < (int)uVar13);
          }
          iVar6 = (int)(iVar2 * 0x1000 - (uVar10 - iVar12)) / (int)uVar10;
          uVar14 = iVar3 + iVar6 + 1;
          uVar13 = iVar6 * uVar10 + (uVar10 - iVar12);
          do {
            iVar6 = (int)uVar13 >> 0xc;
            if (iVar2 + 2 <= iVar6) {
              __assert_fail("indx < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a0,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            if (((int)uVar14 < 0) || (iVar12 = filter->b_len, iVar12 <= (int)uVar14)) {
              __assert_fail("data_index >= 0 && data_index < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a2,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            if (filter->b_end <= (int)uVar14) {
              __assert_fail("data_index < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a3,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            fVar1 = filter->coeffs[iVar6];
            dVar19 = dVar19 + (double)filter->buffer[uVar14] *
                              ((double)(uVar13 & 0xfff) * 0.000244140625 *
                               (double)(filter->coeffs[(long)iVar6 + 1] - fVar1) + (double)fVar1);
            uVar13 = uVar13 - uVar10;
            uVar14 = uVar14 - 1;
          } while (0 < (int)uVar13);
          lVar11 = filter->out_gen;
          data->data_out[lVar11] = (float)((dVar17 / (double)filter->index_inc) * (dVar21 + dVar19))
          ;
          lVar11 = lVar11 + 1;
          dVar21 = dVar20 + 1.0 / dVar18;
          dVar17 = dVar21 - (double)(int)ROUND(dVar21);
          auVar16._0_8_ = ~-(ulong)(dVar17 < 0.0) & (ulong)dVar17;
          auVar16._8_8_ = 0;
          auVar4._8_4_ = auVar22._8_4_;
          auVar4._0_8_ = (ulong)(dVar17 + 1.0) & -(ulong)(dVar17 < 0.0);
          auVar4._12_4_ = auVar22._12_4_;
          auVar22 = auVar16 | auVar4;
          dVar20 = auVar22._0_8_;
          filter->out_gen = lVar11;
          filter->b_current = ((int)ROUND(dVar21 - dVar20) * state->channels + iVar3) % iVar12;
        } while (lVar11 < filter->out_count);
      }
      state->last_position = dVar20;
      state->last_ratio = dVar18;
      iVar9 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar9;
      data->output_frames_gen = filter->out_gen / (long)iVar9;
      SVar5 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar5;
}

Assistant:

static SRC_ERROR
sinc_mono_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate > filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		data->data_out [filter->out_gen] = (float) ((float_increment / filter->index_inc) *
										calc_output_single (filter, increment, start_filter_index)) ;
		filter->out_gen ++ ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}